

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O0

bool QFontDatabase::bold(QString *family,QString *style)

{
  QtFontFoundry *pQVar1;
  bool bVar2;
  int iVar3;
  QFontDatabasePrivate *styleName;
  QtFontFamily *pQVar4;
  Key *in_RSI;
  QtFontFoundry *in_RDI;
  long in_FS_OFFSET;
  QtFontStyle *s;
  int k;
  QtFontFoundry *foundry;
  int j;
  QtFontFamily *f;
  QFontDatabasePrivate *d;
  QtFontFoundry allStyles;
  QString foundryName;
  QString familyName;
  Key styleKey;
  QMutexLocker<QRecursiveMutex> locker;
  undefined6 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 in_stack_ffffffffffffff3f;
  QtFontStyle *in_stack_ffffffffffffff40;
  int local_b4;
  int local_a8;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  byte bVar5;
  QFontDatabasePrivate *in_stack_ffffffffffffff88;
  QString *in_stack_ffffffffffffff90;
  Key *in_stack_ffffffffffffff98;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined4 local_1c;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x7439f0);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x743a24);
  parseFontName((QString *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                &in_RDI->name,(QString *)in_RSI);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::operator()
            ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
              *)CONCAT17(in_stack_ffffffffffffff3f,
                         CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)));
  QMutexLocker<QRecursiveMutex>::QMutexLocker
            ((QMutexLocker<QRecursiveMutex> *)in_stack_ffffffffffffff40,
             (QRecursiveMutex *)
             CONCAT17(in_stack_ffffffffffffff3f,
                      CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)));
  styleName = QFontDatabasePrivate::ensureFontDatabase();
  memset(&stack0xffffffffffffff88,0xaa,0x28);
  QtFontFoundry::QtFontFoundry
            ((QtFontFoundry *)in_stack_ffffffffffffff40,
             (QString *)
             CONCAT17(in_stack_ffffffffffffff3f,
                      CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)));
  pQVar4 = QFontDatabasePrivate::family
                     (in_stack_ffffffffffffff88,
                      (QString *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                      (FamilyRequestFlags)((ulong)in_RDI >> 0x20));
  if (pQVar4 == (QtFontFamily *)0x0) {
    bVar5 = false;
  }
  else {
    for (local_a8 = 0; local_a8 < pQVar4->count; local_a8 = local_a8 + 1) {
      pQVar1 = pQVar4->foundries[local_a8];
      bVar2 = QString::isEmpty((QString *)0x743b13);
      if ((bVar2) ||
         (iVar3 = QString::compare((QString *)pQVar1,(CaseSensitivity)&local_50), iVar3 == 0)) {
        for (local_b4 = 0; local_b4 < pQVar1->count; local_b4 = local_b4 + 1) {
          QtFontFoundry::style(in_RDI,in_RSI,(QString *)styleName,SUB81((ulong)pQVar4 >> 0x38,0));
        }
      }
    }
    local_1c = 0xaaaaaaaa;
    QtFontStyle::Key::Key(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    in_stack_ffffffffffffff40 =
         QtFontFoundry::style(in_RDI,in_RSI,(QString *)styleName,SUB81((ulong)pQVar4 >> 0x38,0));
    bVar5 = false;
    if (in_stack_ffffffffffffff40 != (QtFontStyle *)0x0) {
      bVar5 = 699 < (*(ushort *)&in_stack_ffffffffffffff40->key >> 2 & 0x3ff);
    }
  }
  QtFontFoundry::~QtFontFoundry((QtFontFoundry *)in_stack_ffffffffffffff40);
  QMutexLocker<QRecursiveMutex>::~QMutexLocker
            ((QMutexLocker<QRecursiveMutex> *)in_stack_ffffffffffffff40);
  QString::~QString((QString *)0x743c35);
  QString::~QString((QString *)0x743c42);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool QFontDatabase::bold(const QString &family,
                          const QString &style)
{
    QString familyName, foundryName;
    parseFontName(family, foundryName, familyName);

    QMutexLocker locker(fontDatabaseMutex());
    QFontDatabasePrivate *d = QFontDatabasePrivate::ensureFontDatabase();

    QtFontFoundry allStyles(foundryName);
    QtFontFamily *f = d->family(familyName);
    if (!f) return false;

    for (int j = 0; j < f->count; j++) {
        QtFontFoundry *foundry = f->foundries[j];
        if (foundryName.isEmpty() ||
            foundry->name.compare(foundryName, Qt::CaseInsensitive) == 0) {
            for (int k = 0; k < foundry->count; k++)
                allStyles.style(foundry->styles[k]->key, foundry->styles[k]->styleName, true);
        }
    }

    QtFontStyle::Key styleKey(style);
    QtFontStyle *s = allStyles.style(styleKey, style);
    return s && s->key.weight >= QFont::Bold;
}